

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headlossmodel.cpp
# Opt level: O0

void HeadLossModel::addCVHeadLoss(double q,double *headLoss,double *gradient)

{
  double dVar1;
  double dVar2;
  double b;
  double a;
  double *gradient_local;
  double *headLoss_local;
  double q_local;
  
  dVar1 = q * 100000000.0;
  dVar2 = sqrt(dVar1 * dVar1 + 1e-06);
  *headLoss = (dVar1 - dVar2) / 2.0 + *headLoss;
  *gradient = ((1.0 - dVar1 / dVar2) * 100000000.0) / 2.0 + *gradient;
  return;
}

Assistant:

void HeadLossModel::addCVHeadLoss(double q, double& headLoss, double& gradient)
{
    double a = HIGH_RESISTANCE * q;
    double b = sqrt(a*a + HEAD_EPSILON);
    headLoss += (a - b) / 2.0;
    gradient += HIGH_RESISTANCE * ( 1.0 - a/b) / 2.0;
}